

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  int axis;
  int i;
  int reduced_axes_num;
  int *axes_ptr;
  bool reduce_c;
  bool reduce_d;
  bool reduce_h;
  bool reduce_w;
  int axes_flag [4];
  int dims;
  float in_stack_00001308;
  undefined1 in_stack_0000130c;
  undefined1 in_stack_0000130d;
  undefined1 in_stack_0000130e;
  undefined1 in_stack_0000130f;
  Mat *in_stack_00001310;
  Mat *in_stack_00001318;
  int in_stack_00002ec0;
  int in_stack_00002ec8;
  Option *in_stack_00002ed0;
  int local_64;
  int local_60;
  undefined4 local_48 [7];
  int local_2c;
  long *local_8;
  
  local_2c = *(int *)(in_RSI + 0x28);
  memset(local_48,0,0x10);
  if (*(int *)(in_RDI + 0xd4) == 0) {
    local_8 = (long *)(in_RDI + 0xe0);
    lVar1 = *local_8;
    iVar2 = *(int *)(in_RDI + 0x10c);
    for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
      local_64 = *(int *)(lVar1 + (long)local_60 * 4);
      if (local_64 < 0) {
        local_64 = local_2c + local_64;
      }
      local_48[local_64] = 1;
    }
  }
  iVar2 = reduction_op(in_stack_00001318,in_stack_00001310,(bool)in_stack_0000130f,
                       (bool)in_stack_0000130e,(bool)in_stack_0000130d,(bool)in_stack_0000130c,
                       in_stack_00002ec0,in_stack_00002ec8,in_stack_00001308,in_stack_00002ed0);
  return iVar2;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[4] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_d = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_d = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims;
            axes_flag[axis] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
        else if (dims == 4)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_d = true;
            if (axes_flag[2] == 1) reduce_h = true;
            if (axes_flag[3] == 1) reduce_w = true;
        }
    }

    return reduction_op(bottom_blob, top_blob, reduce_w, reduce_h, reduce_d, reduce_c, keepdims, operation, coeff, opt);
}